

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first.c
# Opt level: O0

char * hexdump(uchar *buffer,size_t len)

{
  ulong local_30;
  size_t i;
  char *p;
  size_t len_local;
  uchar *buffer_local;
  
  i = (size_t)hexdump::dump;
  if (len < 0xc9) {
    for (local_30 = 0; local_30 < len; local_30 = local_30 + 1) {
      curl_msnprintf(i,4,"%02x ",buffer[local_30]);
      i = i + 3;
    }
    buffer_local = (uchar *)hexdump::dump;
  }
  else {
    buffer_local = (uchar *)0x0;
  }
  return (char *)buffer_local;
}

Assistant:

char *hexdump(const unsigned char *buffer, size_t len)
{
  static char dump[200 * 3 + 1];
  char *p = dump;
  size_t i;
  if(len > 200)
    return NULL;
  for(i = 0; i<len; i++, p += 3)
    snprintf(p, 4, "%02x ", buffer[i]);
  return dump;
}